

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Type> *
wasm::WATParser::maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  undefined8 uVar1;
  undefined4 uVar2;
  ParseModuleTypesCtx *pPVar3;
  bool bVar4;
  Lexer *pLVar5;
  HeapTypeT *pHVar6;
  bool bVar7;
  HeapTypeT HVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  HeapTypeT ht;
  HeapTypeT ht_00;
  HeapTypeT ht_01;
  HeapTypeT ht_02;
  HeapTypeT ht_03;
  HeapTypeT ht_04;
  HeapTypeT ht_05;
  HeapTypeT ht_06;
  HeapTypeT ht_07;
  HeapTypeT ht_08;
  HeapTypeT ht_09;
  HeapTypeT ht_10;
  HeapTypeT ht_11;
  HeapTypeT ht_12;
  HeapTypeT ht_13;
  Type local_468;
  allocator<char> local_459;
  string local_458;
  Err local_438;
  uint local_414;
  Err local_410;
  Err *local_3f0;
  Err *err;
  undefined1 local_3d8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> _val;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> type;
  Nullability nullability;
  Type local_340;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  uintptr_t local_328;
  Exactness local_320;
  uintptr_t local_318;
  Exactness local_310;
  Type local_308;
  basic_string_view<char,_std::char_traits<char>_> local_300;
  uintptr_t local_2f0;
  Exactness local_2e8;
  uintptr_t local_2e0;
  Exactness local_2d8;
  Type local_2d0;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  uintptr_t local_2b8;
  Exactness local_2b0;
  uintptr_t local_2a8;
  Exactness local_2a0;
  Type local_298;
  basic_string_view<char,_std::char_traits<char>_> local_290;
  uintptr_t local_280;
  Exactness local_278;
  uintptr_t local_270;
  Exactness local_268;
  Type local_260;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  uintptr_t local_248;
  Exactness local_240;
  uintptr_t local_238;
  Exactness local_230;
  Type local_228;
  basic_string_view<char,_std::char_traits<char>_> local_220;
  uintptr_t local_210;
  Exactness local_208;
  uintptr_t local_200;
  Exactness local_1f8;
  Type local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  uintptr_t local_1d8;
  Exactness local_1d0;
  uintptr_t local_1c8;
  Exactness local_1c0;
  Type local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  uintptr_t local_1a0;
  Exactness local_198;
  uintptr_t local_190;
  Exactness local_188;
  Type local_180;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  uintptr_t local_168;
  Exactness local_160;
  uintptr_t local_158;
  Exactness local_150;
  Type local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  uintptr_t local_130;
  Exactness local_128;
  uintptr_t local_120;
  Exactness local_118;
  Type local_110;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  uintptr_t local_f8;
  Exactness local_f0;
  uintptr_t local_e8;
  Exactness local_e0;
  Type local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  uintptr_t local_c0;
  Exactness local_b8;
  uintptr_t local_b0;
  Exactness local_a8;
  Type local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  uintptr_t local_88;
  Exactness local_80;
  uintptr_t local_78;
  Exactness local_70;
  Type local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  uintptr_t local_50;
  Exactness local_48;
  uintptr_t local_40;
  Exactness local_38;
  Type local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseModuleTypesCtx *local_18;
  ParseModuleTypesCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseModuleTypesCtx *)__return_storage_ptr__;
  local_28 = sv("funcref",7);
  bVar4 = Lexer::takeKeyword(&ctx->in,local_28);
  pPVar3 = local_18;
  if (bVar4) {
    HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeFuncType
                      (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,Unshared
                      );
    local_50 = (uintptr_t)HVar8.type.id;
    local_48 = HVar8.exactness;
    ht._12_4_ = 0;
    ht.type.id = SUB128(HVar8._0_12_,0);
    ht.exactness = SUB124(HVar8._0_12_,8);
    local_40 = local_50;
    local_38 = local_48;
    local_30.id = (uintptr_t)
                  TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                            (&pPVar3->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,ht,
                             Nullable);
    MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_30);
  }
  else {
    pLVar5 = &local_18->in;
    local_60 = sv("externref",9);
    bVar4 = Lexer::takeKeyword(pLVar5,local_60);
    pPVar3 = local_18;
    if (bVar4) {
      HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExternType
                        (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                         Unshared);
      local_88 = (uintptr_t)HVar8.type.id;
      local_80 = HVar8.exactness;
      ht_00._12_4_ = 0;
      ht_00.type.id = SUB128(HVar8._0_12_,0);
      ht_00.exactness = SUB124(HVar8._0_12_,8);
      local_78 = local_88;
      local_70 = local_80;
      local_68.id = (uintptr_t)
                    TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                              (&pPVar3->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                               ht_00,Nullable);
      MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_68);
    }
    else {
      pLVar5 = &local_18->in;
      local_98 = sv("anyref",6);
      bVar4 = Lexer::takeKeyword(pLVar5,local_98);
      pPVar3 = local_18;
      if (bVar4) {
        HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeAnyType
                          (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                           Unshared);
        local_c0 = (uintptr_t)HVar8.type.id;
        local_b8 = HVar8.exactness;
        ht_01._12_4_ = 0;
        ht_01.type.id = SUB128(HVar8._0_12_,0);
        ht_01.exactness = SUB124(HVar8._0_12_,8);
        local_b0 = local_c0;
        local_a8 = local_b8;
        local_a0.id = (uintptr_t)
                      TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                (&pPVar3->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                 ht_01,Nullable);
        MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_a0);
      }
      else {
        pLVar5 = &local_18->in;
        local_d0 = sv("eqref",5);
        bVar4 = Lexer::takeKeyword(pLVar5,local_d0);
        pPVar3 = local_18;
        if (bVar4) {
          HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeEqType
                            (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                             Unshared);
          local_f8 = (uintptr_t)HVar8.type.id;
          local_f0 = HVar8.exactness;
          ht_02._12_4_ = 0;
          ht_02.type.id = SUB128(HVar8._0_12_,0);
          ht_02.exactness = SUB124(HVar8._0_12_,8);
          local_e8 = local_f8;
          local_e0 = local_f0;
          local_d8.id = (uintptr_t)
                        TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                  (&pPVar3->
                                    super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,ht_02,
                                   Nullable);
          MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_d8);
        }
        else {
          pLVar5 = &local_18->in;
          local_108 = sv("i31ref",6);
          bVar4 = Lexer::takeKeyword(pLVar5,local_108);
          pPVar3 = local_18;
          if (bVar4) {
            HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeI31Type
                              (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                               Unshared);
            local_130 = (uintptr_t)HVar8.type.id;
            local_128 = HVar8.exactness;
            ht_03._12_4_ = 0;
            ht_03.type.id = SUB128(HVar8._0_12_,0);
            ht_03.exactness = SUB124(HVar8._0_12_,8);
            local_120 = local_130;
            local_118 = local_128;
            local_110.id = (uintptr_t)
                           TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                     (&pPVar3->
                                       super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                      ht_03,Nullable);
            MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_110);
          }
          else {
            pLVar5 = &local_18->in;
            local_140 = sv("structref",9);
            bVar4 = Lexer::takeKeyword(pLVar5,local_140);
            pPVar3 = local_18;
            if (bVar4) {
              HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStructType
                                (&local_18->
                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,Unshared
                                );
              local_168 = (uintptr_t)HVar8.type.id;
              local_160 = HVar8.exactness;
              ht_04._12_4_ = 0;
              ht_04.type.id = SUB128(HVar8._0_12_,0);
              ht_04.exactness = SUB124(HVar8._0_12_,8);
              local_158 = local_168;
              local_150 = local_160;
              local_148.id = (uintptr_t)
                             TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                       (&pPVar3->
                                         super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                        ht_04,Nullable);
              MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_148);
            }
            else {
              pLVar5 = &local_18->in;
              local_178 = sv("arrayref",8);
              bVar4 = Lexer::takeKeyword(pLVar5,local_178);
              pPVar3 = local_18;
              if (bVar4) {
                HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeArrayType
                                  (&local_18->
                                    super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                   Unshared);
                local_1a0 = (uintptr_t)HVar8.type.id;
                local_198 = HVar8.exactness;
                ht_05._12_4_ = 0;
                ht_05.type.id = SUB128(HVar8._0_12_,0);
                ht_05.exactness = SUB124(HVar8._0_12_,8);
                local_190 = local_1a0;
                local_188 = local_198;
                local_180.id = (uintptr_t)
                               TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                         (&pPVar3->
                                           super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                          ,ht_05,Nullable);
                MaybeResult<wasm::Type>::MaybeResult<wasm::Type>(__return_storage_ptr__,&local_180);
              }
              else {
                pLVar5 = &local_18->in;
                local_1b0 = sv("exnref",6);
                bVar4 = Lexer::takeKeyword(pLVar5,local_1b0);
                pPVar3 = local_18;
                if (bVar4) {
                  HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExnType
                                    (&local_18->
                                      super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                     Unshared);
                  local_1d8 = (uintptr_t)HVar8.type.id;
                  local_1d0 = HVar8.exactness;
                  ht_06._12_4_ = 0;
                  ht_06.type.id = SUB128(HVar8._0_12_,0);
                  ht_06.exactness = SUB124(HVar8._0_12_,8);
                  local_1c8 = local_1d8;
                  local_1c0 = local_1d0;
                  local_1b8.id = (uintptr_t)
                                 TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                           (&pPVar3->
                                             super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                            ,ht_06,Nullable);
                  MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                            (__return_storage_ptr__,&local_1b8);
                }
                else {
                  pLVar5 = &local_18->in;
                  local_1e8 = sv("stringref",9);
                  bVar4 = Lexer::takeKeyword(pLVar5,local_1e8);
                  pPVar3 = local_18;
                  if (bVar4) {
                    HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStringType
                                      (&local_18->
                                        super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                       Unshared);
                    local_210 = (uintptr_t)HVar8.type.id;
                    local_208 = HVar8.exactness;
                    ht_07._12_4_ = 0;
                    ht_07.type.id = SUB128(HVar8._0_12_,0);
                    ht_07.exactness = SUB124(HVar8._0_12_,8);
                    local_200 = local_210;
                    local_1f8 = local_208;
                    local_1f0.id = (uintptr_t)
                                   TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeRefType
                                             (&pPVar3->
                                               super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                              ,ht_07,Nullable);
                    MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                              (__return_storage_ptr__,&local_1f0);
                  }
                  else {
                    pLVar5 = &local_18->in;
                    local_220 = sv("contref",7);
                    bVar4 = Lexer::takeKeyword(pLVar5,local_220);
                    pPVar3 = local_18;
                    if (bVar4) {
                      HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeContType
                                        (&local_18->
                                          super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                         Unshared);
                      local_248 = (uintptr_t)HVar8.type.id;
                      local_240 = HVar8.exactness;
                      ht_08._12_4_ = 0;
                      ht_08.type.id = SUB128(HVar8._0_12_,0);
                      ht_08.exactness = SUB124(HVar8._0_12_,8);
                      local_238 = local_248;
                      local_230 = local_240;
                      local_228.id = (uintptr_t)
                                     TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                     makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                 ,ht_08,Nullable);
                      MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                (__return_storage_ptr__,&local_228);
                    }
                    else {
                      pLVar5 = &local_18->in;
                      local_258 = sv("nullref",7);
                      bVar4 = Lexer::takeKeyword(pLVar5,local_258);
                      pPVar3 = local_18;
                      if (bVar4) {
                        HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoneType
                                          (&local_18->
                                            super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                           ,Unshared);
                        local_280 = (uintptr_t)HVar8.type.id;
                        local_278 = HVar8.exactness;
                        ht_09._12_4_ = 0;
                        ht_09.type.id = SUB128(HVar8._0_12_,0);
                        ht_09.exactness = SUB124(HVar8._0_12_,8);
                        local_270 = local_280;
                        local_268 = local_278;
                        local_260.id = (uintptr_t)
                                       TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                       makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,ht_09,Nullable);
                        MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                  (__return_storage_ptr__,&local_260);
                      }
                      else {
                        pLVar5 = &local_18->in;
                        local_290 = sv("nullexternref",0xd);
                        bVar4 = Lexer::takeKeyword(pLVar5,local_290);
                        pPVar3 = local_18;
                        if (bVar4) {
                          HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoextType
                                            (&local_18->
                                              super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                             ,Unshared);
                          local_2b8 = (uintptr_t)HVar8.type.id;
                          local_2b0 = HVar8.exactness;
                          ht_10._12_4_ = 0;
                          ht_10.type.id = SUB128(HVar8._0_12_,0);
                          ht_10.exactness = SUB124(HVar8._0_12_,8);
                          local_2a8 = local_2b8;
                          local_2a0 = local_2b0;
                          local_298.id = (uintptr_t)
                                         TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                         makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,ht_10,Nullable);
                          MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                    (__return_storage_ptr__,&local_298);
                        }
                        else {
                          pLVar5 = &local_18->in;
                          local_2c8 = sv("nullfuncref",0xb);
                          bVar4 = Lexer::takeKeyword(pLVar5,local_2c8);
                          pPVar3 = local_18;
                          if (bVar4) {
                            HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                    makeNofuncType(&local_18->
                                                                                                        
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,Unshared);
                            local_2f0 = (uintptr_t)HVar8.type.id;
                            local_2e8 = HVar8.exactness;
                            ht_11._12_4_ = 0;
                            ht_11.type.id = SUB128(HVar8._0_12_,0);
                            ht_11.exactness = SUB124(HVar8._0_12_,8);
                            local_2e0 = local_2f0;
                            local_2d8 = local_2e8;
                            local_2d0.id = (uintptr_t)
                                           TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                           makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,ht_11,Nullable);
                            MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                      (__return_storage_ptr__,&local_2d0);
                          }
                          else {
                            pLVar5 = &local_18->in;
                            local_300 = sv("nullexnref",10);
                            bVar4 = Lexer::takeKeyword(pLVar5,local_300);
                            pPVar3 = local_18;
                            if (bVar4) {
                              HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                      makeNoexnType(&local_18->
                                                                                                          
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,Unshared);
                              local_328 = (uintptr_t)HVar8.type.id;
                              local_320 = HVar8.exactness;
                              ht_12._12_4_ = 0;
                              ht_12.type.id = SUB128(HVar8._0_12_,0);
                              ht_12.exactness = SUB124(HVar8._0_12_,8);
                              local_318 = local_328;
                              local_310 = local_320;
                              local_308.id = (uintptr_t)
                                             TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                             makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,ht_12,Nullable);
                              MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                        (__return_storage_ptr__,&local_308);
                            }
                            else {
                              pLVar5 = &local_18->in;
                              local_338 = sv("nullcontref",0xb);
                              bVar4 = Lexer::takeKeyword(pLVar5,local_338);
                              pPVar3 = local_18;
                              if (bVar4) {
                                HVar8 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                        makeNocontType(&local_18->
                                                                                                                
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,Unshared);
                                ht_13._12_4_ = 0;
                                ht_13.type.id = SUB128(HVar8._0_12_,0);
                                ht_13.exactness = SUB124(HVar8._0_12_,8);
                                local_340.id = (uintptr_t)
                                               TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                               makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,ht_13,Nullable);
                                MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                          (__return_storage_ptr__,&local_340);
                              }
                              else {
                                pLVar5 = &local_18->in;
                                bVar9 = sv("ref",3);
                                bVar4 = Lexer::takeSExprStart(pLVar5,bVar9);
                                if (bVar4) {
                                  pLVar5 = &local_18->in;
                                  bVar9 = sv("null",4);
                                  bVar4 = Lexer::takeKeyword(pLVar5,bVar9);
                                  __return_storage_ptr___00 =
                                       (__index_type *)
                                       ((long)&_val.val.
                                               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                       + 0x20);
                                  heaptype<wasm::WATParser::ParseModuleTypesCtx>
                                            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                              *)__return_storage_ptr___00,local_18);
                                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                  ::Result((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                            *)local_3d8,
                                           (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                            *)__return_storage_ptr___00);
                                  local_3f0 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                              ::getErr((
                                                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                                  *)local_3d8);
                                  bVar7 = local_3f0 != (Err *)0x0;
                                  if (bVar7) {
                                    wasm::Err::Err(&local_410,local_3f0);
                                    MaybeResult<wasm::Type>::MaybeResult
                                              (__return_storage_ptr__,&local_410);
                                    wasm::Err::~Err(&local_410);
                                  }
                                  local_414 = (uint)bVar7;
                                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                  ::~Result((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                             *)local_3d8);
                                  if (local_414 == 0) {
                                    bVar7 = Lexer::takeRParen(&local_18->in);
                                    pPVar3 = local_18;
                                    if (bVar7) {
                                      pHVar6 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                               ::operator*((
                                                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                                  *)((long)&_val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  + 0x20));
                                      uVar1 = pHVar6->type;
                                      uVar2 = pHVar6->exactness;
                                      HVar8.exactness = uVar2;
                                      HVar8.type.id = uVar1;
                                      HVar8._12_4_ = 0;
                                      local_468.id = (uintptr_t)
                                                                                                          
                                                  TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ::makeRefType(&pPVar3->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,HVar8,(uint)bVar4);
                                      MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                                                (__return_storage_ptr__,&local_468);
                                      local_414 = 1;
                                    }
                                    else {
                                      pLVar5 = &local_18->in;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_458,"expected end of reftype",
                                                 &local_459);
                                      Lexer::err(&local_438,pLVar5,&local_458);
                                      MaybeResult<wasm::Type>::MaybeResult
                                                (__return_storage_ptr__,&local_438);
                                      wasm::Err::~Err(&local_438);
                                      std::__cxx11::string::~string((string *)&local_458);
                                      std::allocator<char>::~allocator(&local_459);
                                      local_414 = 1;
                                    }
                                  }
                                  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                  ::~Result((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                                             *)((long)&_val.val.
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                               + 0x20));
                                }
                                else {
                                  MaybeResult<wasm::Type>::MaybeResult(__return_storage_ptr__);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> maybeReftype(Ctx& ctx) {
  if (ctx.in.takeKeyword("funcref"sv)) {
    return ctx.makeRefType(ctx.makeFuncType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("externref"sv)) {
    return ctx.makeRefType(ctx.makeExternType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("anyref"sv)) {
    return ctx.makeRefType(ctx.makeAnyType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("eqref"sv)) {
    return ctx.makeRefType(ctx.makeEqType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("i31ref"sv)) {
    return ctx.makeRefType(ctx.makeI31Type(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("structref"sv)) {
    return ctx.makeRefType(ctx.makeStructType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("arrayref"sv)) {
    return ctx.makeRefType(ctx.makeArrayType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("exnref"sv)) {
    return ctx.makeRefType(ctx.makeExnType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("stringref"sv)) {
    return ctx.makeRefType(ctx.makeStringType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("contref"sv)) {
    return ctx.makeRefType(ctx.makeContType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullref"sv)) {
    return ctx.makeRefType(ctx.makeNoneType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullexternref"sv)) {
    return ctx.makeRefType(ctx.makeNoextType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullfuncref"sv)) {
    return ctx.makeRefType(ctx.makeNofuncType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullexnref"sv)) {
    return ctx.makeRefType(ctx.makeNoexnType(Unshared), Nullable);
  }
  if (ctx.in.takeKeyword("nullcontref"sv)) {
    return ctx.makeRefType(ctx.makeNocontType(Unshared), Nullable);
  }

  if (!ctx.in.takeSExprStart("ref"sv)) {
    return {};
  }

  auto nullability = ctx.in.takeKeyword("null"sv) ? Nullable : NonNullable;

  auto type = heaptype(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of reftype");
  }

  return ctx.makeRefType(*type, nullability);
}